

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

int Gia_ManPerformGlaOld(Gia_Man_t *pAig,Abs_Par_t *pPars,int fStartVta)

{
  byte bVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  sat_solver2 *psVar4;
  Vec_Set_t *pVVar5;
  uint *__dest;
  int **ppiVar6;
  Vec_Wrd_t *__ptr;
  Gla_Obj_t *__ptr_00;
  bool bVar7;
  ABC_INT64_T AVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  Gla_Man_t *pGVar13;
  Abc_Cex_t *pAVar14;
  Abs_Par_t *pAVar15;
  Gla_Man_t *pGVar16;
  Vec_Int_t *pVVar17;
  Prf_Man_t *pPVar18;
  Vec_Int_t *pVVar19;
  int *piVar20;
  Vec_Wrd_t *pVVar21;
  word *pwVar22;
  Abc_Frame_t *pAbc;
  Gia_Obj_t *pGVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  int iVar28;
  ulong uVar29;
  Gia_Man_t *pGVar30;
  long lVar31;
  int iVar32;
  Gla_Man_t *pGVar33;
  char *pcVar34;
  Gla_Man_t *pGVar35;
  Gia_Man_t *pGVar36;
  uint *in_R8;
  int nFramesMaxOld;
  double dVar37;
  int Status;
  int nConfls;
  timespec ts;
  long local_488;
  int local_47c;
  Gia_Man_t *local_478;
  uint local_46c;
  double local_468;
  ulong local_460;
  int local_454;
  Abc_Cex_t *local_450;
  ulong local_448;
  Abs_Par_t *local_440;
  int local_434;
  int local_430;
  int local_42c;
  Gla_Man_t *local_428;
  uint local_420;
  int local_41c;
  Vec_Int_t local_418 [62];
  
  local_478 = pAig;
  iVar9 = clock_gettime(3,(timespec *)local_418);
  if (iVar9 < 0) {
    local_488 = -1;
  }
  else {
    local_488 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
  }
  pVVar19 = local_478->vCos;
  iVar9 = pVVar19->nSize;
  iVar32 = local_478->nRegs;
  if (iVar9 - iVar32 != 1) {
    __assert_fail("Gia_ManPoNum(pAig) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x670,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
  }
  iVar28 = pPars->nFramesMax;
  if ((iVar28 != 0) && (iVar28 < pPars->nFramesStart)) {
    __assert_fail("pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                  ,0x671,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
  }
  if (iVar9 <= iVar32) {
LAB_00604bbf:
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar9 < 1) {
LAB_00604bde:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar9 = *pVVar19->pArray;
  local_440 = pPars;
  if (((long)iVar9 < 0) || (uVar11 = local_478->nObjs, (int)uVar11 <= iVar9)) {
LAB_00604ba0:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar3 = local_478->pObjs;
  pGVar23 = pGVar3 + iVar9;
  uVar12 = (uint)*(undefined8 *)pGVar23;
  if ((~*(ulong *)(pGVar23 + -(ulong)(uVar12 & 0x1fffffff)) & 0x1fffffff1fffffff) == 0) {
    if ((uVar12 >> 0x1d & 1) == 0) {
      puts("Sequential miter is trivially UNSAT.");
      return 1;
    }
    if (local_478->pCexSeq != (Abc_Cex_t *)0x0) {
      free(local_478->pCexSeq);
      local_478->pCexSeq = (Abc_Cex_t *)0x0;
    }
    pGVar30 = local_478;
    pAVar14 = Abc_CexMakeTriv(local_478->nRegs,local_478->vCis->nSize - local_478->nRegs,1,0);
    pGVar30->pCexSeq = pAVar14;
    puts("Sequential miter is trivially SAT.");
    return 0;
  }
  if (local_478->vGateClasses == (Vec_Int_t *)0x0) {
    if (fStartVta == 0) {
      pVVar17 = (Vec_Int_t *)malloc(0x10);
      uVar12 = 0x10;
      if (0xe < uVar11 - 1) {
        uVar12 = uVar11;
      }
      pVVar17->nSize = 0;
      pVVar17->nCap = uVar12;
      if (uVar12 == 0) {
        piVar20 = (int *)0x0;
      }
      else {
        piVar20 = (int *)malloc((long)(int)uVar12 << 2);
      }
      pVVar17->pArray = piVar20;
      pVVar17->nSize = uVar11;
      if (piVar20 != (int *)0x0) {
        memset(piVar20,0,(long)(int)uVar11 << 2);
      }
      local_478->vGateClasses = pVVar17;
      if ((int)uVar11 < 1) {
LAB_00604c79:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *piVar20 = 1;
      if (pVVar19->nSize <= iVar32) goto LAB_00604bbf;
      if (pVVar19->nSize < 1) goto LAB_00604bde;
      uVar12 = *pVVar19->pArray;
      if (uVar11 <= uVar12) goto LAB_00604ba0;
      uVar12 = uVar12 - (*(uint *)(pGVar3 + uVar12) & 0x1fffffff);
      if (uVar11 <= uVar12) goto LAB_00604c79;
      piVar20[uVar12] = 1;
      goto LAB_00602e7f;
    }
    iVar9 = pPars->nFramesStart;
    iVar32 = pPars->nTimeOut;
    iVar2 = pPars->fDumpVabs;
    pPars->nFramesMax = iVar9;
    iVar10 = 2;
    if (iVar9 / 2 < 2) {
      iVar10 = iVar9 / 2;
    }
    pPars->nFramesStart = iVar10 + 1;
    pPars->nTimeOut = 0x14;
    pPars->fDumpVabs = 0;
    iVar10 = Gia_VtaPerformInt(local_478,pPars);
    pPars->nFramesMax = iVar28;
    pPars->nFramesStart = iVar9;
    pPars->nTimeOut = iVar32;
    pPars->fDumpVabs = iVar2;
    if (local_478->vGateClasses != (Vec_Int_t *)0x0) {
      piVar20 = local_478->vGateClasses->pArray;
      if (piVar20 != (int *)0x0) {
        free(piVar20);
        local_478->vGateClasses->pArray = (int *)0x0;
      }
      if (local_478->vGateClasses != (Vec_Int_t *)0x0) {
        free(local_478->vGateClasses);
        local_478->vGateClasses = (Vec_Int_t *)0x0;
      }
    }
    if (local_478->vObjClasses != (Vec_Int_t *)0x0) {
      pVVar19 = Gia_VtaConvertToGla(local_478,local_478->vObjClasses);
      local_478->vGateClasses = pVVar19;
    }
    if (local_478->vObjClasses != (Vec_Int_t *)0x0) {
      piVar20 = local_478->vObjClasses->pArray;
      if (piVar20 != (int *)0x0) {
        free(piVar20);
        local_478->vObjClasses->pArray = (int *)0x0;
      }
      if (local_478->vObjClasses != (Vec_Int_t *)0x0) {
        free(local_478->vObjClasses);
        local_478->vObjClasses = (Vec_Int_t *)0x0;
      }
    }
    if (iVar10 == 0) {
      return 0;
    }
    if (local_478->vGateClasses == (Vec_Int_t *)0x0) {
      return iVar10;
    }
  }
  else {
LAB_00602e7f:
    iVar10 = -1;
    pPars = local_440;
  }
  local_434 = iVar10;
  pGVar13 = Gla_ManStart(local_478,pPars);
  iVar32 = 3;
  iVar9 = clock_gettime(3,(timespec *)local_418);
  if (iVar9 < 0) {
    lVar25 = -1;
  }
  else {
    lVar25 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
  }
  pGVar13->timeInit = lVar25 - local_488;
  lVar25 = (long)pGVar13->pPars->nTimeOut;
  local_428 = pGVar13;
  if (lVar25 != 0) {
    psVar4 = pGVar13->pSat;
    iVar32 = 3;
    iVar9 = clock_gettime(3,(timespec *)local_418);
    if (iVar9 < 0) {
      lVar26 = -1;
    }
    else {
      lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    psVar4->nRuntimeLimit = lVar26 + lVar25 * 1000000;
  }
  pGVar13 = local_428;
  if (local_428->pPars->fVerbose != 0) {
    Abc_Print(iVar32,"Running gate-level abstraction (GLA) with the following parameters:\n");
    Abc_Print(iVar32,"FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%.\n",
              (ulong)(uint)pPars->nFramesMax,(ulong)(uint)pPars->nConfLimit,
              (ulong)(uint)pPars->nTimeOut,(ulong)(uint)pPars->nRatioMin);
    in_R8 = (uint *)(ulong)(uint)pPars->nLearnedPerce;
    Abc_Print(iVar32,"LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n",
              (ulong)(uint)pPars->nLearnedStart);
    Abc_Print(iVar32,
              " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n"
             );
  }
  pAVar15 = pGVar13->pPars;
  if (-1 < pAVar15->nFramesMax) {
    local_450 = (Abc_Cex_t *)0x0;
    uVar27 = 0;
    local_454 = 0;
    local_430 = 0;
    uVar11 = 0;
LAB_006031a4:
    local_42c = (int)(pGVar13->pSat->stats).conflicts;
    iVar9 = (int)uVar27;
    pAVar15->iFrame = iVar9;
    local_420 = uVar11;
    Gia_GlaAddTimeFrame(pGVar13,iVar9);
    uVar29 = (ulong)(iVar9 + 1);
    local_46c = 0;
    local_460 = uVar27;
    local_448 = uVar29;
    do {
      pVVar19 = local_418;
      iVar9 = clock_gettime(3,(timespec *)pVVar19);
      if (iVar9 < 0) {
        lVar25 = 1;
      }
      else {
        lVar25 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_418[0].pArray),8);
        lVar25 = ((lVar25 >> 7) - (lVar25 >> 0x3f)) + local_418[0]._0_8_ * -1000000;
      }
      pGVar16 = (Gla_Man_t *)
                Gla_ManUnsatCore(pGVar13,(int)uVar27,pGVar13->pSat,pPars->nConfLimit,(int)in_R8,
                                 &local_47c,&local_41c);
      if (local_47c == -1) {
LAB_00603862:
        psVar4 = pGVar13->pSat;
        pPVar18 = psVar4->pPrf2;
        if (pPVar18 != (Prf_Man_t *)0x0) {
          pVVar19 = pPVar18->vSaved;
          if (pVVar19->pArray != (int *)0x0) {
            free(pVVar19->pArray);
            pVVar19->pArray = (int *)0x0;
          }
          if (pVVar19 != (Vec_Int_t *)0x0) {
            free(pVVar19);
          }
          pVVar21 = pPVar18->vInfo;
          if (pVVar21->pArray != (word *)0x0) {
            free(pVVar21->pArray);
            pVVar21->pArray = (word *)0x0;
          }
          if (pVVar21 != (Vec_Wrd_t *)0x0) {
            free(pVVar21);
          }
          free(pPVar18);
        }
        psVar4->pPrf2 = (Prf_Man_t *)0x0;
        uVar29 = local_448;
        goto LAB_00603a62;
      }
      if (pGVar13->pSat->nRuntimeLimit != 0) {
        iVar9 = clock_gettime(3,(timespec *)pVVar19);
        if (iVar9 < 0) {
          lVar26 = -1;
        }
        else {
          lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
        }
        if (pGVar13->pSat->nRuntimeLimit < lVar26) goto LAB_00603862;
      }
      if (local_47c == 1) {
        psVar4 = pGVar13->pSat;
        pPVar18 = psVar4->pPrf2;
        if (pPVar18 != (Prf_Man_t *)0x0) {
          pVVar19 = pPVar18->vSaved;
          if (pVVar19->pArray != (int *)0x0) {
            free(pVVar19->pArray);
            pVVar19->pArray = (int *)0x0;
          }
          if (pVVar19 != (Vec_Int_t *)0x0) {
            free(pVVar19);
          }
          pVVar21 = pPVar18->vInfo;
          if (pVVar21->pArray != (word *)0x0) {
            free(pVVar21->pArray);
            pVVar21->pArray = (word *)0x0;
          }
          if (pVVar21 != (Vec_Wrd_t *)0x0) {
            free(pVVar21);
          }
          free(pPVar18);
        }
        pVVar19 = local_418;
        psVar4->pPrf2 = (Prf_Man_t *)0x0;
        pGVar35 = (Gla_Man_t *)0x3;
        iVar32 = clock_gettime(3,(timespec *)pVVar19);
        iVar9 = (int)pVVar19;
        if (iVar32 < 0) {
          lVar26 = -1;
        }
        else {
          lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
        }
        pGVar13->timeUnsat = pGVar13->timeUnsat + lVar26 + lVar25;
        goto LAB_00603a58;
      }
      pGVar35 = (Gla_Man_t *)0x3;
      pVVar17 = pVVar19;
      iVar9 = clock_gettime(3,(timespec *)pVVar19);
      iVar32 = (int)pVVar17;
      if (iVar9 < 0) {
        lVar26 = -1;
      }
      else {
        lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      pGVar13->timeSat = pGVar13->timeSat + lVar26 + lVar25;
      if (local_47c != 0) {
        __assert_fail("Status == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x6cd,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
      }
      pGVar13->nCexes = pGVar13->nCexes + 1;
      iVar9 = Abc_FrameIsBridgeMode();
      if ((iVar9 != 0) && (local_454 != 0)) {
        Gia_GlaSendCancel(pGVar35,iVar32);
        local_454 = 0;
      }
      clock_gettime(3,(timespec *)pVVar19);
      if (pPars->fAddLayer == 0) {
        pGVar35 = pGVar13;
        pVVar17 = Gla_ManRefinement(pGVar13);
        iVar9 = (int)pVVar19;
        if (pVVar17 == (Vec_Int_t *)0x0) goto LAB_006039c5;
      }
      else {
        pVVar17 = Gla_ManCollectPPis(pGVar13,pVVar19);
      }
      uVar27 = local_460;
      if (local_450 != (Abc_Cex_t *)0x0) {
        __assert_fail("pCex == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x6e8,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
      }
      psVar4 = pGVar13->pSat;
      if (local_46c == 0) {
        if (psVar4->qhead != psVar4->qtail) {
          __assert_fail("s->qhead == s->qtail",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                        ,0xfa,"void sat_solver2_bookmark(sat_solver2 *)");
        }
        iVar9 = psVar4->size;
        psVar4->iVarPivot = iVar9;
        psVar4->iTrailPivot = psVar4->qhead;
        pVVar5 = psVar4->pPrf1;
        if (pVVar5 != (Vec_Set_t *)0x0) {
          psVar4->hProofPivot =
               (pVVar5->iPage << ((byte)pVVar5->nPageSize & 0x1f)) +
               (int)*pVVar5->pPages[pVVar5->iPage];
        }
        __dest = psVar4->activity2;
        *(undefined8 *)(psVar4->Mem).BookMarkE = *(undefined8 *)(psVar4->Mem).nEntries;
        iVar32 = (psVar4->Mem).iPage[0];
        bVar1 = (byte)(psVar4->Mem).nPageSize;
        ppiVar6 = (psVar4->Mem).pPages;
        (psVar4->Mem).BookMarkH[0] = iVar32 << (bVar1 & 0x1f) | *ppiVar6[iVar32];
        iVar32 = (psVar4->Mem).iPage[1];
        in_R8 = (uint *)ppiVar6[iVar32];
        (psVar4->Mem).BookMarkH[1] = iVar32 << (bVar1 & 0x1f) | *in_R8;
        if (__dest != (uint *)0x0) {
          psVar4->var_inc2 = psVar4->var_inc;
          memcpy(__dest,psVar4->activity,(long)iVar9 << 2);
        }
        pGVar13->vAddedNew->nSize = 0;
        pGVar13->nAbsOld = pGVar13->vAbs->nSize;
        psVar4 = pGVar13->pSat;
        if (psVar4->pPrf2 != (Prf_Man_t *)0x0) {
          __assert_fail("p->pSat->pPrf2 == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                        ,0x6f7,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
        }
        local_430 = pGVar13->nSatVars;
        if (psVar4->pPrf1 == (Vec_Set_t *)0x0) {
          pPVar18 = (Prf_Man_t *)calloc(1,0x30);
          pPVar18->iFirst = -1;
          pPVar18->iFirst2 = -1;
          pVVar21 = (Vec_Wrd_t *)malloc(0x10);
          pVVar21->nCap = 1000;
          pVVar21->nSize = 0;
          pwVar22 = (word *)malloc(8000);
          pVVar21->pArray = pwVar22;
          pPVar18->vInfo = pVVar21;
          pVVar19 = (Vec_Int_t *)malloc(0x10);
          pVVar19->nCap = 1000;
          pVVar19->nSize = 0;
          piVar20 = (int *)malloc(4000);
          pVVar19->pArray = piVar20;
          pPVar18->vSaved = pVVar19;
          psVar4->pPrf2 = pPVar18;
          uVar27 = local_460;
        }
        uVar29 = local_448;
        if (psVar4->pPrf2 != (Prf_Man_t *)0x0) {
          pGVar13->nProofIds = 0;
          pVVar19 = pGVar13->vProofIds;
          uVar11 = pGVar13->pGia->nObjs;
          if (pVVar19->nCap < (int)uVar11) {
            if (pVVar19->pArray == (int *)0x0) {
              piVar20 = (int *)malloc((long)(int)uVar11 << 2);
            }
            else {
              piVar20 = (int *)realloc(pVVar19->pArray,(long)(int)uVar11 << 2);
            }
            pVVar19->pArray = piVar20;
            if (piVar20 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar19->nCap = uVar11;
          }
          if (0 < (int)uVar11) {
            memset(pVVar19->pArray,0xff,(ulong)uVar11 * 4);
          }
          pVVar19->nSize = uVar11;
          pPVar18 = local_428->pSat->pPrf2;
          if (pPVar18->iFirst != -1) {
            __assert_fail("p->iFirst == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof2.h"
                          ,0x7a,"void Prf_ManRestart(Prf_Man_t *, Vec_Int_t *, int, int)");
          }
          uVar11 = pVVar17->nSize;
          pVVar19 = local_428->vProofIds;
          pPVar18->iFirst = (local_428->pSat->stats).learnts;
          pPVar18->nWords = (((int)uVar11 >> 6) + 1) - (uint)((uVar11 & 0x3f) == 0);
          pPVar18->vId2Pr = pVVar19;
          pPVar18->pInfo = (word *)0x0;
          pPVar18->vInfo->nSize = 0;
          uVar29 = local_448;
          pGVar13 = local_428;
        }
      }
      else {
        pPVar18 = psVar4->pPrf2;
        pPars = local_440;
        if (pPVar18 != (Prf_Man_t *)0x0) {
          if (pPVar18->iFirst < 0) {
            __assert_fail("p->iFirst >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof2.h"
                          ,0x85,"void Prf_ManGrow(Prf_Man_t *, int)");
          }
          if (pPVar18->pInfo != (word *)0x0) {
            __assert_fail("p->pInfo == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satProof2.h"
                          ,0x86,"void Prf_ManGrow(Prf_Man_t *, int)");
          }
          uVar11 = pVVar17->nSize + pGVar13->nProofIds;
          iVar9 = pPVar18->nWords;
          if (iVar9 * 0x40 <= (int)uVar11) {
            iVar32 = (((int)uVar11 >> 6) + 1) - (uint)((uVar11 & 0x3f) == 0);
            iVar28 = iVar9 * 2;
            if (iVar32 == iVar28 || SBORROW4(iVar32,iVar28) != iVar32 + iVar9 * -2 < 0) {
              iVar32 = iVar28;
            }
            uVar27 = (long)pPVar18->vInfo->nSize / (long)iVar9;
            local_468 = (double)(uVar27 & 0xffffffff);
            iVar9 = ((int)uVar27 + 1000) * iVar32;
            pVVar21 = (Vec_Wrd_t *)malloc(0x10);
            if (iVar9 - 1U < 0xf) {
              iVar9 = 0x10;
            }
            pVVar21->nSize = 0;
            pVVar21->nCap = iVar9;
            if (iVar9 == 0) {
              pwVar22 = (word *)0x0;
            }
            else {
              pwVar22 = (word *)malloc((long)iVar9 << 3);
            }
            pVVar21->pArray = pwVar22;
            if (0 < local_468._0_4_) {
              iVar9 = 0;
              do {
                uVar11 = pPVar18->nWords * iVar9;
                if (((int)uVar11 < 0) || (pPVar18->vInfo->nSize <= (int)uVar11)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
                }
                pPVar18->pInfo = pPVar18->vInfo->pArray + uVar11;
                lVar25 = 0;
                if (0 < pPVar18->nWords) {
                  do {
                    Vec_WrdPush(pVVar21,pPVar18->pInfo[lVar25]);
                    lVar25 = lVar25 + 1;
                  } while (lVar25 < pPVar18->nWords);
                }
                iVar28 = iVar32 - (int)lVar25;
                if (iVar28 != 0 && (int)lVar25 <= iVar32) {
                  do {
                    Vec_WrdPush(pVVar21,0);
                    iVar28 = iVar28 + -1;
                  } while (iVar28 != 0);
                }
                iVar9 = iVar9 + 1;
              } while (iVar9 != local_468._0_4_);
            }
            __ptr = pPVar18->vInfo;
            if (__ptr->pArray != (word *)0x0) {
              free(__ptr->pArray);
              __ptr->pArray = (word *)0x0;
            }
            pGVar13 = local_428;
            if (__ptr != (Vec_Wrd_t *)0x0) {
              free(__ptr);
            }
            pPVar18->vInfo = pVVar21;
            pPVar18->nWords = iVar32;
            pPVar18->pInfo = (word *)0x0;
            uVar29 = local_448;
            uVar27 = local_460;
            pPars = local_440;
          }
        }
      }
      Gia_GlaAddToAbs(pGVar13,pVVar17,1);
      Gia_GlaAddOneSlice(pGVar13,(int)uVar27,pVVar17);
      if (pVVar17->pArray != (int *)0x0) {
        free(pVVar17->pArray);
        pVVar17->pArray = (int *)0x0;
      }
      if (pVVar17 != (Vec_Int_t *)0x0) {
        free(pVVar17);
      }
      if (pGVar13->pPars->fVerbose != 0) {
        AVar8 = (pGVar13->pSat->stats).conflicts;
        iVar9 = clock_gettime(3,(timespec *)local_418);
        if (iVar9 < 0) {
          lVar25 = -1;
        }
        else {
          lVar25 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
        }
        in_R8 = (uint *)(ulong)local_46c;
        Gla_ManAbsPrintFrame
                  (pGVar13,-1,(int)uVar29,(int)AVar8 - local_42c,local_46c,lVar25 - local_488);
      }
      local_46c = local_46c + 1;
    } while( true );
  }
  uVar29 = 0;
  local_450 = (Abc_Cex_t *)0x0;
LAB_00603e34:
  pAVar14 = local_450;
  iVar9 = pGVar13->pPars->fVerbose;
  if (local_450 != (Abc_Cex_t *)0x0) {
    if (iVar9 != 0) {
      putchar(10);
    }
    if (local_478->pCexSeq != (Abc_Cex_t *)0x0) {
      free(local_478->pCexSeq);
      local_478->pCexSeq = (Abc_Cex_t *)0x0;
    }
    pGVar30 = local_478;
    local_478->pCexSeq = pAVar14;
    local_434 = 0;
    pGVar36 = local_478;
    iVar9 = Gia_ManVerifyCex(local_478,pAVar14,0);
    iVar32 = (int)pGVar36;
    if (iVar9 == 0) {
      Abc_Print(iVar32,"    Gia_ManPerformGlaOld(): CEX verification has failed!\n");
    }
    Abc_Print(iVar32,"Counter-example detected in frame %d.  ",uVar29 & 0xffffffff);
    pGVar13->pPars->iFrame = pAVar14->iFrame + -1;
    pVVar19 = pGVar30->vGateClasses;
    if (pVVar19 != (Vec_Int_t *)0x0) {
      piVar20 = pVVar19->pArray;
      if (piVar20 != (int *)0x0) {
        free(piVar20);
        local_478->vGateClasses->pArray = (int *)0x0;
        pGVar30 = local_478;
      }
      if (pGVar30->vGateClasses != (Vec_Int_t *)0x0) {
        free(pGVar30->vGateClasses);
        pGVar30->vGateClasses = (Vec_Int_t *)0x0;
      }
    }
    goto LAB_006041aa;
  }
  if ((iVar9 != 0) && (local_47c == -1)) {
    putchar(10);
  }
  if (local_478->vGateClasses != (Vec_Int_t *)0x0) {
    piVar20 = local_478->vGateClasses->pArray;
    if (piVar20 != (int *)0x0) {
      free(piVar20);
      local_478->vGateClasses->pArray = (int *)0x0;
    }
    if (local_478->vGateClasses != (Vec_Int_t *)0x0) {
      free(local_478->vGateClasses);
      local_478->vGateClasses = (Vec_Int_t *)0x0;
    }
  }
  pGVar30 = local_478;
  pGVar16 = pGVar13;
  pVVar19 = Gla_ManTranslate(pGVar13);
  iVar9 = (int)pGVar16;
  pGVar30->vGateClasses = pVVar19;
  pAVar15 = pGVar13->pPars;
  if (local_47c == -1) {
    if (pAVar15->nTimeOut == 0) {
LAB_00604106:
      uVar11 = pPars->nConfLimit;
      if ((uVar11 == 0) || ((int)(pGVar13->pSat->stats).conflicts < (int)uVar11)) {
        pGVar16 = pGVar13;
        iVar32 = Gia_GlaAbsCount(pGVar13,0,0);
        iVar9 = (int)pGVar16;
        uVar27 = (ulong)(uint)pPars->nRatioMin;
        if (iVar32 < ((100 - pPars->nRatioMin) * (pGVar13->nObjs + -1)) / 100) {
          Abc_Print(iVar9,"Abstraction stopped for unknown reason in frame %d.  ",
                    uVar29 & 0xffffffff);
          goto LAB_006041aa;
        }
        pcVar34 = "The ratio of abstracted objects is less than %d %% in frame %d.  ";
        uVar24 = uVar29 & 0xffffffff;
        goto LAB_00603fc3;
      }
      uVar12 = pGVar13->pPars->nFramesNoChange;
      pcVar34 = "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ";
    }
    else {
      iVar9 = 3;
      iVar32 = clock_gettime(3,(timespec *)local_418);
      if (iVar32 < 0) {
        lVar25 = -1;
      }
      else {
        lVar25 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      if (lVar25 < pGVar13->pSat->nRuntimeLimit) goto LAB_00604106;
      uVar11 = pGVar13->pPars->nTimeOut;
      uVar12 = pGVar13->pPars->nFramesNoChange;
      pcVar34 = "Timeout %d sec in frame %d with a %d-stable abstraction.    ";
    }
    Abc_Print(iVar9,pcVar34,(ulong)uVar11,uVar29 & 0xffffffff,(ulong)uVar12);
  }
  else {
    pAVar15->iFrame = pAVar15->iFrame + 1;
    uVar24 = (ulong)(uint)pAVar15->nFramesNoChange;
    pcVar34 = "GLA completed %d frames with a %d-stable abstraction.  ";
    uVar27 = uVar29 & 0xffffffff;
LAB_00603fc3:
    Abc_Print(iVar9,pcVar34,uVar27,uVar24);
  }
LAB_006041aa:
  iVar32 = 3;
  iVar9 = clock_gettime(3,(timespec *)local_418);
  if (iVar9 < 0) {
    lVar25 = -1;
  }
  else {
    lVar25 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
  }
  Abc_Print(iVar32,"%s =","Time");
  Abc_Print(iVar32,"%9.2f sec\n",(double)(lVar25 - local_488) / 1000000.0);
  if (pGVar13->pPars->fVerbose != 0) {
    iVar32 = 3;
    iVar9 = clock_gettime(3,(timespec *)local_418);
    lVar26 = -1;
    lVar25 = -1;
    if (-1 < iVar9) {
      lVar25 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    pGVar13->timeOther =
         lVar25 - (pGVar13->timeUnsat + local_488 + pGVar13->timeSat + pGVar13->timeCex +
                  pGVar13->timeInit);
    Abc_Print(iVar32,"%s =","Runtime: Initializing");
    lVar25 = pGVar13->timeInit;
    iVar32 = 3;
    iVar9 = clock_gettime(3,(timespec *)local_418);
    if (-1 < iVar9) {
      lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    dVar37 = 0.0;
    if (lVar26 != local_488) {
      local_468 = (double)pGVar13->timeInit * 100.0;
      iVar32 = 3;
      iVar9 = clock_gettime(3,(timespec *)local_418);
      if (iVar9 < 0) {
        lVar26 = -1;
      }
      else {
        lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      dVar37 = local_468 / (double)(lVar26 - local_488);
    }
    Abc_Print(iVar32,"%9.2f sec (%6.2f %%)\n",(double)lVar25 / 1000000.0,dVar37);
    Abc_Print(iVar32,"%s =","Runtime: Solver UNSAT");
    lVar25 = pGVar13->timeUnsat;
    iVar32 = 3;
    iVar9 = clock_gettime(3,(timespec *)local_418);
    if (iVar9 < 0) {
      lVar26 = -1;
    }
    else {
      lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    dVar37 = 0.0;
    if (lVar26 != local_488) {
      local_468 = (double)pGVar13->timeUnsat * 100.0;
      iVar32 = 3;
      iVar9 = clock_gettime(3,(timespec *)local_418);
      if (iVar9 < 0) {
        lVar26 = -1;
      }
      else {
        lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      dVar37 = local_468 / (double)(lVar26 - local_488);
    }
    Abc_Print(iVar32,"%9.2f sec (%6.2f %%)\n",(double)lVar25 / 1000000.0,dVar37);
    Abc_Print(iVar32,"%s =","Runtime: Solver SAT  ");
    lVar25 = pGVar13->timeSat;
    iVar32 = 3;
    iVar9 = clock_gettime(3,(timespec *)local_418);
    if (iVar9 < 0) {
      lVar26 = -1;
    }
    else {
      lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    dVar37 = 0.0;
    if (lVar26 != local_488) {
      local_468 = (double)pGVar13->timeSat * 100.0;
      iVar32 = 3;
      iVar9 = clock_gettime(3,(timespec *)local_418);
      if (iVar9 < 0) {
        lVar26 = -1;
      }
      else {
        lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      dVar37 = local_468 / (double)(lVar26 - local_488);
    }
    Abc_Print(iVar32,"%9.2f sec (%6.2f %%)\n",(double)lVar25 / 1000000.0,dVar37);
    Abc_Print(iVar32,"%s =","Runtime: Refinement  ");
    lVar25 = pGVar13->timeCex;
    iVar32 = 3;
    iVar9 = clock_gettime(3,(timespec *)local_418);
    if (iVar9 < 0) {
      lVar26 = -1;
    }
    else {
      lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    dVar37 = 0.0;
    if (lVar26 != local_488) {
      local_468 = (double)pGVar13->timeCex * 100.0;
      iVar32 = 3;
      iVar9 = clock_gettime(3,(timespec *)local_418);
      if (iVar9 < 0) {
        lVar26 = -1;
      }
      else {
        lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      dVar37 = local_468 / (double)(lVar26 - local_488);
    }
    Abc_Print(iVar32,"%9.2f sec (%6.2f %%)\n",(double)lVar25 / 1000000.0,dVar37);
    Abc_Print(iVar32,"%s =","Runtime: Other       ");
    lVar25 = pGVar13->timeOther;
    iVar32 = 3;
    iVar9 = clock_gettime(3,(timespec *)local_418);
    if (iVar9 < 0) {
      lVar26 = -1;
    }
    else {
      lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    dVar37 = 0.0;
    if (lVar26 != local_488) {
      local_468 = (double)pGVar13->timeOther * 100.0;
      iVar32 = 3;
      iVar9 = clock_gettime(3,(timespec *)local_418);
      if (iVar9 < 0) {
        lVar26 = -1;
      }
      else {
        lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      dVar37 = local_468 / (double)(lVar26 - local_488);
    }
    Abc_Print(iVar32,"%9.2f sec (%6.2f %%)\n",(double)lVar25 / 1000000.0,dVar37);
    Abc_Print(iVar32,"%s =","Runtime: TOTAL       ");
    iVar9 = clock_gettime(3,(timespec *)local_418);
    lVar26 = -1;
    lVar25 = -1;
    if (-1 < iVar9) {
      lVar25 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    iVar32 = 3;
    iVar9 = clock_gettime(3,(timespec *)local_418);
    if (-1 < iVar9) {
      lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
    }
    dVar37 = 0.0;
    if (lVar26 != local_488) {
      iVar9 = clock_gettime(3,(timespec *)local_418);
      lVar31 = -1;
      lVar26 = -1;
      if (-1 < iVar9) {
        lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      local_468 = (double)(lVar26 - local_488) * 100.0;
      iVar32 = 3;
      iVar9 = clock_gettime(3,(timespec *)local_418);
      if (-1 < iVar9) {
        lVar31 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      dVar37 = local_468 / (double)(lVar31 - local_488);
    }
    Abc_Print(iVar32,"%9.2f sec (%6.2f %%)\n",(double)(lVar25 - local_488) / 1000000.0,dVar37);
    Gla_ManReportMemory(pGVar13);
  }
  Gla_ManStop(pGVar13);
  fflush(_stdout);
  return local_434;
LAB_006039c5:
  psVar4 = pGVar13->pSat;
  pGVar33 = (Gla_Man_t *)psVar4->pPrf2;
  if (pGVar33 != (Gla_Man_t *)0x0) {
    __ptr_00 = pGVar33->pObjRoot;
    if (*(void **)__ptr_00->Fanins != (void *)0x0) {
      free(*(void **)__ptr_00->Fanins);
      __ptr_00->Fanins[0] = 0;
      __ptr_00->Fanins[1] = 0;
    }
    if (__ptr_00 != (Gla_Obj_t *)0x0) {
      free(__ptr_00);
    }
    pVVar19 = pGVar33->vAbs;
    if (pVVar19->pArray != (int *)0x0) {
      free(pVVar19->pArray);
      pVVar19->pArray = (int *)0x0;
    }
    if (pVVar19 != (Vec_Int_t *)0x0) {
      free(pVVar19);
    }
    free(pGVar33);
    pGVar35 = pGVar33;
  }
  psVar4->pPrf2 = (Prf_Man_t *)0x0;
  local_450 = pGVar13->pGia->pCexSeq;
  pGVar13->pGia->pCexSeq = (Abc_Cex_t *)0x0;
LAB_00603a58:
  uVar29 = local_448;
  if (local_450 == (Abc_Cex_t *)0x0) {
    if (local_47c != 1) {
      __assert_fail("Status == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                    ,0x712,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
    }
    if (pGVar16 == (Gla_Man_t *)0x0) {
      iVar32 = 1;
    }
    else {
      iVar32 = *(int *)((long)&pGVar16->pGia0 + 4) + 1;
      pGVar33 = pGVar16;
      pGVar35 = pGVar13;
      Gia_GlaAddToCounters(pGVar13,(Vec_Int_t *)pGVar16);
      iVar9 = (int)pGVar33;
    }
    if (local_46c == 0) {
      piVar20 = &pGVar13->pPars->nFramesNoChange;
      *piVar20 = *piVar20 + 1;
      if (pGVar16 != (Gla_Man_t *)0x0) {
        if (pGVar16->pGia != (Gia_Man_t *)0x0) {
          free(pGVar16->pGia);
          pGVar16->pGia = (Gia_Man_t *)0x0;
        }
        free(pGVar16);
        pGVar35 = pGVar16;
      }
    }
    else {
      pGVar13->pPars->nFramesNoChange = 0;
      sat_solver2_rollback(pGVar13->pSat);
      Gla_ManRollBack(pGVar13);
      pGVar13->nSatVars = local_430;
      Gia_GlaAddToAbs(pGVar13,(Vec_Int_t *)pGVar16,0);
      Gia_GlaAddOneSlice(pGVar13,(int)local_460,(Vec_Int_t *)pGVar16);
      if (pGVar16->pGia != (Gia_Man_t *)0x0) {
        free(pGVar16->pGia);
        pGVar16->pGia = (Gia_Man_t *)0x0;
      }
      if (pGVar16 != (Gla_Man_t *)0x0) {
        free(pGVar16);
      }
      iVar9 = clock_gettime(3,(timespec *)local_418);
      if (iVar9 < 0) {
        lVar25 = 1;
      }
      else {
        lVar25 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_418[0].pArray),8);
        lVar25 = ((lVar25 >> 7) - (lVar25 >> 0x3f)) + local_418[0]._0_8_ * -1000000;
      }
      pGVar16 = (Gla_Man_t *)
                Gla_ManUnsatCore(pGVar13,(int)local_460,pGVar13->pSat,pPars->nConfLimit,(int)in_R8,
                                 &local_47c,&local_41c);
      pGVar35 = (Gla_Man_t *)0x3;
      pVVar19 = local_418;
      iVar28 = clock_gettime(3,(timespec *)pVVar19);
      iVar9 = (int)pVVar19;
      if (iVar28 < 0) {
        lVar26 = -1;
      }
      else {
        lVar26 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      pGVar13->timeUnsat = pGVar13->timeUnsat + lVar26 + lVar25;
      if (pGVar16 != (Gla_Man_t *)0x0) {
        if (pGVar16->pGia != (Gia_Man_t *)0x0) {
          free(pGVar16->pGia);
          pGVar16->pGia = (Gia_Man_t *)0x0;
        }
        free(pGVar16);
        pGVar35 = pGVar16;
      }
      if (local_47c == -1) {
        local_450 = (Abc_Cex_t *)0x0;
        goto LAB_00603a62;
      }
      if (local_47c == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                      ,0x738,"int Gia_ManPerformGlaOld(Gia_Man_t *, Abs_Par_t *, int)");
      }
    }
    uVar27 = local_460;
    if (pGVar13->pPars->fVerbose != 0) {
      AVar8 = (pGVar13->pSat->stats).conflicts;
      iVar9 = clock_gettime(3,(timespec *)local_418);
      if (iVar9 < 0) {
        lVar25 = -1;
      }
      else {
        lVar25 = (long)local_418[0].pArray / 1000 + local_418[0]._0_8_ * 1000000;
      }
      in_R8 = (uint *)(ulong)local_46c;
      pGVar35 = pGVar13;
      iVar9 = iVar32;
      Gla_ManAbsPrintFrame
                (pGVar13,iVar32,(int)uVar29,(int)AVar8 - local_42c,local_46c,lVar25 - local_488);
    }
    if ((local_420 != 0 && 2 < (uint)uVar27) && local_46c == 0) {
      iVar32 = Abc_FrameIsBridgeMode();
      if (iVar32 != 0) {
        if (local_454 != 0) {
          Gia_GlaSendCancel(pGVar35,iVar9);
        }
        Gia_GlaSendAbsracted(pGVar13,iVar9);
        local_454 = 1;
      }
      if (pGVar13->pPars->fDumpVabs != 0) {
        Abc_FrameSetStatus(-1);
        Abc_FrameSetCex((Abc_Cex_t *)0x0);
        Abc_FrameSetNFrames((int)uVar29);
        pcVar34 = pGVar13->pPars->pFileVabs;
        if (pcVar34 == (char *)0x0) {
          pcVar34 = "glabs.aig";
        }
        pcVar34 = Extra_FileNameGenericAppend(pcVar34,".status");
        sprintf((char *)local_418,"write_status %s",pcVar34);
        pAbc = Abc_FrameGetGlobalFrame();
        Cmd_CommandExecute(pAbc,(char *)local_418);
        Gia_GlaDumpAbsracted(pGVar13,pPars->fVerbose);
      }
    }
    iVar9 = Gia_GlaAbsCount(pGVar13,0,0);
    bVar7 = ((100 - pPars->nRatioMin) * (pGVar13->nObjs + -1)) / 100 <= iVar9;
    if (bVar7) {
      local_47c = -1;
    }
    bVar7 = !bVar7;
    local_450 = (Abc_Cex_t *)0x0;
  }
  else {
LAB_00603a62:
    bVar7 = false;
    uVar27 = local_460;
  }
  if (!bVar7) {
    uVar29 = uVar27 & 0xffffffff;
    goto LAB_00603e34;
  }
  pAVar15 = pGVar13->pPars;
  uVar27 = uVar29 & 0xffffffff;
  uVar11 = local_46c;
  if (pAVar15->nFramesMax <= (int)uVar29 && pAVar15->nFramesMax != 0) goto LAB_00603e34;
  goto LAB_006031a4;
}

Assistant:

int Gia_ManPerformGlaOld( Gia_Man_t * pAig, Abs_Par_t * pPars, int fStartVta )
{
    extern int Gia_VtaPerformInt( Gia_Man_t * pAig, Abs_Par_t * pPars );
    extern void Ga2_ManDumpStats( Gia_Man_t * pGia, Abs_Par_t * pPars, sat_solver2 * pSat, int iFrame, int fUseN );
    Gla_Man_t * p;
    Vec_Int_t * vPPis, * vCore;//, * vCore2 = NULL;
    Abc_Cex_t * pCex = NULL;
    int f, i, iPrev, nConfls, Status, nVarsOld = 0, nCoreSize, fOneIsSent = 0, RetValue = -1;
    abctime clk2, clk = Abc_Clock();
    // preconditions
    assert( Gia_ManPoNum(pAig) == 1 );
    assert( pPars->nFramesMax == 0 || pPars->nFramesStart <= pPars->nFramesMax );
    if ( Gia_ObjIsConst0(Gia_ObjFanin0(Gia_ManPo(pAig,0))) )
    {
        if ( !Gia_ObjFaninC0(Gia_ManPo(pAig,0)) )
        {
            printf( "Sequential miter is trivially UNSAT.\n" );
            return 1;
        }
        ABC_FREE( pAig->pCexSeq );
        pAig->pCexSeq = Abc_CexMakeTriv( Gia_ManRegNum(pAig), Gia_ManPiNum(pAig), 1, 0 );
        printf( "Sequential miter is trivially SAT.\n" );
        return 0;
    }

    // compute intial abstraction
    if ( pAig->vGateClasses == NULL )
    {
        if ( fStartVta )
        {
            int nFramesMaxOld   = pPars->nFramesMax;
            int nFramesStartOld = pPars->nFramesStart;
            int nTimeOutOld     = pPars->nTimeOut;
            int nDumpOld        = pPars->fDumpVabs;
            pPars->nFramesMax   = pPars->nFramesStart;
            pPars->nFramesStart = Abc_MinInt( pPars->nFramesStart/2 + 1, 3 );
            pPars->nTimeOut     = 20;
            pPars->fDumpVabs    = 0;
            RetValue = Gia_VtaPerformInt( pAig, pPars );
            pPars->nFramesMax   = nFramesMaxOld;
            pPars->nFramesStart = nFramesStartOld;
            pPars->nTimeOut     = nTimeOutOld;
            pPars->fDumpVabs    = nDumpOld;
            // create gate classes
            Vec_IntFreeP( &pAig->vGateClasses );
            if ( pAig->vObjClasses )
                pAig->vGateClasses = Gia_VtaConvertToGla( pAig, pAig->vObjClasses );
            Vec_IntFreeP( &pAig->vObjClasses );
            // return if VTA solve the problem if could not start
            if ( RetValue == 0 || pAig->vGateClasses == NULL )
                return RetValue;
        }
        else
        {
            pAig->vGateClasses = Vec_IntStart( Gia_ManObjNum(pAig) );
            Vec_IntWriteEntry( pAig->vGateClasses, 0, 1 );
            Vec_IntWriteEntry( pAig->vGateClasses, Gia_ObjFaninId0p(pAig, Gia_ManPo(pAig, 0)), 1 );
        }
    }
    // start the manager
    p = Gla_ManStart( pAig, pPars );
    p->timeInit = Abc_Clock() - clk;
    // set runtime limit
    if ( p->pPars->nTimeOut )
        sat_solver2_set_runtime_limit( p->pSat, p->pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock() );
    // perform initial abstraction
    if ( p->pPars->fVerbose )
    {
        Abc_Print( 1, "Running gate-level abstraction (GLA) with the following parameters:\n" );
        Abc_Print( 1, "FrameMax = %d  ConfMax = %d  Timeout = %d  RatioMin = %d %%.\n", 
            pPars->nFramesMax, pPars->nConfLimit, pPars->nTimeOut, pPars->nRatioMin );
        Abc_Print( 1, "LearnStart = %d  LearnDelta = %d  LearnRatio = %d %%.\n", 
            pPars->nLearnedStart, pPars->nLearnedDelta, pPars->nLearnedPerce );
        Abc_Print( 1, " Frame   %%   Abs  PPI   FF   LUT   Confl  Cex   Vars   Clas   Lrns     Time        Mem\n" );
    }
    for ( f = i = iPrev = 0; !p->pPars->nFramesMax || f < p->pPars->nFramesMax; f++, iPrev = i )
    {
        int nConflsBeg = sat_solver2_nconflicts(p->pSat);
        p->pPars->iFrame = f;

        // load timeframe
        Gia_GlaAddTimeFrame( p, f );

        // iterate as long as there are counter-examples
        for ( i = 0; ; i++ )
        { 
            clk2 = Abc_Clock();
            vCore = Gla_ManUnsatCore( p, f, p->pSat, pPars->nConfLimit, pPars->fVerbose, &Status, &nConfls );
//            assert( (vCore != NULL) == (Status == 1) );
            if ( Status == -1 || (p->pSat->nRuntimeLimit && Abc_Clock() > p->pSat->nRuntimeLimit) ) // resource limit is reached
            {
                Prf_ManStopP( &p->pSat->pPrf2 );
//                if ( Gia_ManRegNum(p->pGia) > 1 ) // for comb cases, return the abstraction
//                    Vec_IntShrink( p->vAbs, p->nAbsOld );
                goto finish;
            }
            if ( Status == 1 )
            {
                Prf_ManStopP( &p->pSat->pPrf2 );
                p->timeUnsat += Abc_Clock() - clk2;
                break;
            } 
            p->timeSat += Abc_Clock() - clk2;
            assert( Status == 0 );
            p->nCexes++;

            // cancel old one if it was sent
            if ( Abc_FrameIsBridgeMode() && fOneIsSent )
            {
                Gia_GlaSendCancel( p, pPars->fVerbose );
                fOneIsSent = 0;
            }

            // perform the refinement
            clk2 = Abc_Clock();
            if ( pPars->fAddLayer )
            {
                vPPis = Gla_ManCollectPPis( p, NULL );
//                Gla_ManExplorePPis( p, vPPis );
            }
            else
            {
                vPPis = Gla_ManRefinement( p );
                if ( vPPis == NULL )
                {
                    Prf_ManStopP( &p->pSat->pPrf2 );
                    pCex = p->pGia->pCexSeq; p->pGia->pCexSeq = NULL;
                    break;
                }
            } 
            assert( pCex == NULL );

            // start proof logging
            if ( i == 0 )
            {
                // create bookmark to be used for rollback
                sat_solver2_bookmark( p->pSat );
                Vec_IntClear( p->vAddedNew );
                p->nAbsOld = Vec_IntSize( p->vAbs );
                nVarsOld = p->nSatVars;
//                p->nLrnOld = sat_solver2_nlearnts( p->pSat );
//                p->nAbsNew = 0;
//                p->nLrnNew = 0;

                // start incremental proof manager
                assert( p->pSat->pPrf2 == NULL );
                if ( p->pSat->pPrf1 == NULL )
                    p->pSat->pPrf2 = Prf_ManAlloc();
                if ( p->pSat->pPrf2 )
                {
                    p->nProofIds = 0;
                    Vec_IntFill( p->vProofIds, Gia_ManObjNum(p->pGia), -1 );
                    Prf_ManRestart( p->pSat->pPrf2, p->vProofIds, sat_solver2_nlearnts(p->pSat), Vec_IntSize(vPPis) );
                }
            }
            else
            {
                // resize the proof logger
                if ( p->pSat->pPrf2 )
                    Prf_ManGrow( p->pSat->pPrf2, p->nProofIds + Vec_IntSize(vPPis) );
            }

            Gia_GlaAddToAbs( p, vPPis, 1 );
            Gia_GlaAddOneSlice( p, f, vPPis );
            Vec_IntFree( vPPis );

            // print the result (do not count it towards change)
            if ( p->pPars->fVerbose )
            Gla_ManAbsPrintFrame( p, -1, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk );
        }
        if ( pCex != NULL )
            break;
        assert( Status == 1 );

        // valid core is obtained
        nCoreSize = 1;
        if ( vCore )
        {
            nCoreSize += Vec_IntSize( vCore );
            Gia_GlaAddToCounters( p, vCore );
        }
        if ( i == 0 )
        {
            p->pPars->nFramesNoChange++;
            Vec_IntFreeP( &vCore );
        }
        else
        {
            p->pPars->nFramesNoChange = 0;
//            p->nAbsNew = Vec_IntSize( p->vAbs ) - p->nAbsOld;
//            p->nLrnNew = Abc_AbsInt( sat_solver2_nlearnts( p->pSat ) - p->nLrnOld );
            // update the SAT solver
            sat_solver2_rollback( p->pSat );
            // update storage
            Gla_ManRollBack( p );
            p->nSatVars = nVarsOld;
            // load this timeframe
            Gia_GlaAddToAbs( p, vCore, 0 );
            Gia_GlaAddOneSlice( p, f, vCore );
            Vec_IntFree( vCore );
            // run SAT solver
            clk2 = Abc_Clock();
            vCore = Gla_ManUnsatCore( p, f, p->pSat, pPars->nConfLimit, p->pPars->fVerbose, &Status, &nConfls );
            p->timeUnsat += Abc_Clock() - clk2;
//            assert( (vCore != NULL) == (Status == 1) );
            Vec_IntFreeP( &vCore );
            if ( Status == -1 ) // resource limit is reached
                break;
            if ( Status == 0 )
            {
                assert( 0 );
    //            Vta_ManSatVerify( p );
                // make sure, there was no initial abstraction (otherwise, it was invalid)
                assert( pAig->vObjClasses == NULL && f < p->pPars->nFramesStart );
    //            pCex = Vga_ManDeriveCex( p );
                break;
            }
        }
        // print the result
        if ( p->pPars->fVerbose )
        Gla_ManAbsPrintFrame( p, nCoreSize, f+1, sat_solver2_nconflicts(p->pSat)-nConflsBeg, i, Abc_Clock() - clk );

        if ( f > 2 && iPrev > 0 && i == 0 ) // change has happened
        {
            if ( Abc_FrameIsBridgeMode() )
            {
                // cancel old one if it was sent
                if ( fOneIsSent )
                    Gia_GlaSendCancel( p, pPars->fVerbose );
                // send new one 
                Gia_GlaSendAbsracted( p, pPars->fVerbose );
                fOneIsSent = 1;
            }

            // dump the model into file
            if ( p->pPars->fDumpVabs )
            {
                char Command[1000];
                Abc_FrameSetStatus( -1 );
                Abc_FrameSetCex( NULL );
                Abc_FrameSetNFrames( f+1 );
                sprintf( Command, "write_status %s", Extra_FileNameGenericAppend((char *)(p->pPars->pFileVabs ? p->pPars->pFileVabs : "glabs.aig"), ".status") );
                Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), Command );
                Gia_GlaDumpAbsracted( p, pPars->fVerbose );
            }
        }

        // check if the number of objects is below limit
        if ( Gia_GlaAbsCount(p,0,0) >= (p->nObjs - 1) * (100 - pPars->nRatioMin) / 100 )
        {
            Status = -1;
            break;
        }
    }
finish:
    // analize the results
    if ( pCex == NULL )
    {
        if ( p->pPars->fVerbose && Status == -1 )
            printf( "\n" );
//        if ( pAig->vGateClasses != NULL )
//            Abc_Print( 1, "Replacing the old abstraction by a new one.\n" );
        Vec_IntFreeP( &pAig->vGateClasses );
        pAig->vGateClasses = Gla_ManTranslate( p );
        if ( Status == -1 )
        {
            if ( p->pPars->nTimeOut && Abc_Clock() >= p->pSat->nRuntimeLimit ) 
                Abc_Print( 1, "Timeout %d sec in frame %d with a %d-stable abstraction.    ", p->pPars->nTimeOut, f, p->pPars->nFramesNoChange );
            else if ( pPars->nConfLimit && sat_solver2_nconflicts(p->pSat) >= pPars->nConfLimit )
                Abc_Print( 1, "Exceeded %d conflicts in frame %d with a %d-stable abstraction.  ", pPars->nConfLimit, f, p->pPars->nFramesNoChange );
            else if ( Gia_GlaAbsCount(p,0,0) >= (p->nObjs - 1) * (100 - pPars->nRatioMin) / 100 )
                Abc_Print( 1, "The ratio of abstracted objects is less than %d %% in frame %d.  ", pPars->nRatioMin, f );
            else
                Abc_Print( 1, "Abstraction stopped for unknown reason in frame %d.  ", f );
        }
        else
        {
            p->pPars->iFrame++;
            Abc_Print( 1, "GLA completed %d frames with a %d-stable abstraction.  ", f, p->pPars->nFramesNoChange );
        }
    }
    else
    {
        if ( p->pPars->fVerbose )
            printf( "\n" );
        ABC_FREE( pAig->pCexSeq );
        pAig->pCexSeq = pCex;
        if ( !Gia_ManVerifyCex( pAig, pCex, 0 ) )
            Abc_Print( 1, "    Gia_ManPerformGlaOld(): CEX verification has failed!\n" );
        Abc_Print( 1, "Counter-example detected in frame %d.  ", f );
        p->pPars->iFrame = pCex->iFrame - 1;
        Vec_IntFreeP( &pAig->vGateClasses );
        RetValue = 0;
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( p->pPars->fVerbose )
    {
        p->timeOther = (Abc_Clock() - clk) - p->timeUnsat - p->timeSat - p->timeCex - p->timeInit;
        ABC_PRTP( "Runtime: Initializing", p->timeInit,   Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver UNSAT", p->timeUnsat,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Solver SAT  ", p->timeSat,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Refinement  ", p->timeCex,    Abc_Clock() - clk );
        ABC_PRTP( "Runtime: Other       ", p->timeOther,  Abc_Clock() - clk );
        ABC_PRTP( "Runtime: TOTAL       ", Abc_Clock() - clk, Abc_Clock() - clk );
        Gla_ManReportMemory( p );
    }
//    Ga2_ManDumpStats( pAig, p->pPars, p->pSat, p->pPars->iFrame, 1 );
    Gla_ManStop( p );
    fflush( stdout );
    return RetValue;
}